

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

ptr __thiscall
gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
shift_into_uninitialized
          (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *this,
          ptr pos,size_ty n_shift)

{
  ptr ppVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  difference_type __d;
  size_ty sVar5;
  ptr ppVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar5 = (this->m_data).
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_size;
  ppVar6 = (this->m_data).
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr + sVar5;
  if (n_shift != 0) {
    uVar9 = 0;
    do {
      puVar2 = (undefined8 *)((long)&ppVar6[-n_shift].first.first + uVar9);
      uVar4 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(ppVar6->first).first + uVar9);
      *puVar3 = *puVar2;
      puVar3[1] = uVar4;
      uVar9 = uVar9 + 0x10;
    } while (uVar9 != n_shift * 0x10);
    sVar5 = (this->m_data).
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_size;
  }
  (this->m_data).
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size =
       sVar5 + n_shift;
  lVar7 = (long)((long)ppVar6 + (n_shift * -0x10 - (long)pos)) >> 4;
  if (0 < lVar7) {
    uVar8 = lVar7 + 1;
    uVar9 = n_shift * 0x10 ^ 0xfffffffffffffff8;
    do {
      ppVar1 = ppVar6 + -1;
      ppVar6[-1].first.first = *(int *)((long)ppVar6 + (uVar9 - 8));
      ppVar6[-1].first.second = *(int *)((long)ppVar6 + (uVar9 - 4));
      ppVar6[-1].second = *(double *)((long)&(ppVar6->first).first + uVar9);
      uVar8 = uVar8 - 1;
      ppVar6 = ppVar1;
    } while (1 < uVar8);
    return ppVar1;
  }
  return ppVar6;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }